

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O1

bool pbrt::RealisticCamera::IntersectSphericalElement
               (Float radius,Float zCenter,Ray *ray,Float *t,Normal3f *n)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  undefined4 uVar6;
  undefined8 uVar5;
  undefined4 uVar7;
  float fVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 extraout_var [60];
  
  auVar16._4_60_ = in_register_00001204;
  auVar16._0_4_ = radius;
  uVar4._0_4_ = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
  uVar4._4_4_ = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar4;
  auVar10 = vmovshdup_avx(auVar23);
  fVar8 = (ray->o).super_Tuple3<pbrt::Point3,_float>.z - zCenter;
  fVar12 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)fVar12),
                            ZEXT416((uint)fVar12));
  fVar21 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
  fVar18 = auVar19._0_4_;
  fVar11 = auVar10._0_4_;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar1)),auVar23,ZEXT416((uint)fVar12));
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar8),ZEXT416((uint)fVar21));
  fVar12 = auVar10._0_4_ + auVar10._0_4_;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar23,auVar23);
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
  auVar23 = vfnmadd231ss_fma(auVar10,auVar16._0_16_,auVar16._0_16_);
  auVar19 = ZEXT416((uint)(auVar23._0_4_ * fVar18 * 4.0));
  auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),auVar19);
  auVar19 = vfnmadd213ss_fma(ZEXT416((uint)(fVar18 * 4.0)),auVar23,auVar19);
  fVar1 = auVar10._0_4_ + auVar19._0_4_;
  if (0.0 <= fVar1) {
    if (fVar1 < 0.0) {
      auVar17._0_4_ = sqrtf(fVar1);
      auVar17._4_60_ = extraout_var;
      auVar10 = auVar17._0_16_;
    }
    else {
      auVar10 = vsqrtss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
    }
    if ((fVar18 != 0.0) || (NAN(fVar18))) {
      auVar19._8_4_ = 0x7fffffff;
      auVar19._0_8_ = 0x7fffffff7fffffff;
      auVar19._12_4_ = 0x7fffffff;
      auVar10 = vpternlogd_avx512vl(auVar10,ZEXT416((uint)fVar12),auVar19,0xe4);
      fVar21 = (fVar12 + auVar10._0_4_) * -0.5;
      fVar18 = fVar21 / fVar18;
      fVar21 = auVar23._0_4_ / fVar21;
      fVar12 = fVar18;
      if (fVar21 < fVar18) {
        fVar12 = fVar21;
        fVar21 = fVar18;
      }
    }
    else {
      auVar10._8_4_ = 0x80000000;
      auVar10._0_8_ = 0x8000000080000000;
      auVar10._12_4_ = 0x80000000;
      auVar10 = vxorps_avx512vl(auVar23,auVar10);
      fVar12 = auVar10._0_4_ / fVar12;
      fVar21 = fVar12;
    }
    if (0.0 <= fVar1) {
      if (radius < 0.0 == 0.0 < (ray->d).super_Tuple3<pbrt::Vector3,_float>.z) {
        bVar9 = fVar21 < fVar12;
      }
      else {
        bVar9 = fVar12 < fVar21;
      }
      fVar12 = (float)((uint)(!bVar9 && fVar12 != fVar21) * (int)fVar21 +
                      (uint)(bVar9 || fVar12 == fVar21) * (int)fVar12);
      *t = fVar12;
      if (fVar12 < 0.0) {
        return 0.0 <= fVar12;
      }
      fVar8 = fVar8 + fVar12 * (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
      uVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar6 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar13._0_4_ = (float)(undefined4)uVar4 + fVar12 * (float)uVar2;
      auVar13._4_4_ = (float)uVar4._4_4_ + fVar12 * (float)uVar6;
      auVar13._8_4_ = fVar12 * 0.0 + 0.0;
      auVar13._12_4_ = fVar12 * 0.0 + 0.0;
      auVar22._0_4_ = auVar13._0_4_ * auVar13._0_4_;
      auVar22._4_4_ = auVar13._4_4_ * auVar13._4_4_;
      auVar22._8_4_ = auVar13._8_4_ * auVar13._8_4_;
      auVar22._12_4_ = auVar13._12_4_ * auVar13._12_4_;
      auVar10 = vhaddps_avx(auVar22,auVar22);
      uVar5 = vmovlps_avx(auVar13);
      (n->super_Tuple3<pbrt::Normal3,_float>).x = (float)(int)uVar5;
      (n->super_Tuple3<pbrt::Normal3,_float>).y = (float)(int)((ulong)uVar5 >> 0x20);
      (n->super_Tuple3<pbrt::Normal3,_float>).z = fVar8;
      fVar12 = auVar10._0_4_ + fVar8 * fVar8;
      if (fVar12 < 0.0) {
        fVar12 = sqrtf(fVar12);
      }
      else {
        auVar10 = vsqrtss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
        fVar12 = auVar10._0_4_;
      }
      auVar20._0_4_ = (n->super_Tuple3<pbrt::Normal3,_float>).z / fVar12;
      auVar20._4_12_ = SUB6012((undefined1  [60])0x0,0);
      fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar13 = ZEXT416((uint)(auVar20._0_4_ * -fVar1));
      auVar23 = vfnmsub213ss_fma(ZEXT416((uint)fVar1),auVar20,auVar13);
      uVar3 = (n->super_Tuple3<pbrt::Normal3,_float>).x;
      uVar7 = (n->super_Tuple3<pbrt::Normal3,_float>).y;
      auVar25._4_4_ = uVar7;
      auVar25._0_4_ = uVar3;
      auVar25._8_8_ = 0;
      auVar14._4_4_ = fVar12;
      auVar14._0_4_ = fVar12;
      auVar14._8_4_ = fVar12;
      auVar14._12_4_ = fVar12;
      auVar10 = vdivps_avx(auVar25,auVar14);
      auVar19 = vmovshdup_avx(auVar10);
      auVar19 = vfnmadd132ss_fma(auVar19,auVar13,
                                 ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.y));
      auVar19 = vfnmadd132ss_fma(auVar10,ZEXT416((uint)(auVar19._0_4_ + auVar23._0_4_)),
                                 ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x));
      auVar24._0_12_ = ZEXT812(0);
      auVar24._12_4_ = 0;
      auVar15 = auVar10;
      if (auVar19._0_4_ < 0.0) {
        auVar15._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
        auVar15._8_4_ = auVar10._8_4_ ^ 0x80000000;
        auVar15._12_4_ = auVar10._12_4_ ^ 0x80000000;
      }
      uVar5 = vcmpss_avx512f(auVar19,auVar24,1);
      bVar9 = (bool)((byte)uVar5 & 1);
      uVar5 = vmovlps_avx(auVar15);
      (n->super_Tuple3<pbrt::Normal3,_float>).x = (float)(int)uVar5;
      (n->super_Tuple3<pbrt::Normal3,_float>).y = (float)(int)((ulong)uVar5 >> 0x20);
      (n->super_Tuple3<pbrt::Normal3,_float>).z =
           (float)((uint)bVar9 * (int)-auVar20._0_4_ + (uint)!bVar9 * (int)auVar20._0_4_);
      return true;
    }
  }
  return false;
}

Assistant:

PBRT_CPU_GPU
    static bool IntersectSphericalElement(Float radius, Float zCenter, const Ray &ray,
                                          Float *t, Normal3f *n) {
        // Compute _t0_ and _t1_ for ray--element intersection
        Point3f o = ray.o - Vector3f(0, 0, zCenter);
        Float A = ray.d.x * ray.d.x + ray.d.y * ray.d.y + ray.d.z * ray.d.z;
        Float B = 2 * (ray.d.x * o.x + ray.d.y * o.y + ray.d.z * o.z);
        Float C = o.x * o.x + o.y * o.y + o.z * o.z - radius * radius;
        Float t0, t1;
        if (!Quadratic(A, B, C, &t0, &t1))
            return false;

        // Select intersection $t$ based on ray direction and element curvature
        bool useCloserT = (ray.d.z > 0) ^ (radius < 0);
        *t = useCloserT ? std::min(t0, t1) : std::max(t0, t1);
        if (*t < 0)
            return false;

        // Compute surface normal of element at ray intersection point
        *n = Normal3f(Vector3f(o + *t * ray.d));
        *n = FaceForward(Normalize(*n), -ray.d);

        return true;
    }